

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O3

int nifti_is_complete_filename(char *fname)

{
  char *pcVar1;
  
  if ((fname == (char *)0x0) || (*fname == '\0')) {
    if (1 < g_opts_0) {
      nifti_is_complete_filename_cold_1();
      return 0;
    }
    return 0;
  }
  pcVar1 = nifti_find_file_extension(fname);
  if (pcVar1 == (char *)0x0) {
    if (g_opts_0 < 1) {
      return 0;
    }
    pcVar1 = "-- no nifti valid extension for filename \'%s\'\n";
  }
  else {
    if (pcVar1 != fname) {
      return 1;
    }
    if (g_opts_0 < 1) {
      return 0;
    }
    pcVar1 = "-- no prefix for filename \'%s\'\n";
  }
  fprintf(_stderr,pcVar1,fname);
  return 0;
}

Assistant:

int nifti_is_complete_filename(const char* fname)
{
   const char * ext;

   /* check input file(s) for sanity */
   if( fname == NULL || *fname == '\0' ){
      if ( g_opts.debug > 1 )
         fprintf(stderr,"-- empty filename in nifti_validfilename()\n");
      return 0;
   }

   ext = nifti_find_file_extension(fname);
   if ( ext == NULL ) { /*Invalid extension given */
      if ( g_opts.debug > 0 )
         fprintf(stderr,"-- no nifti valid extension for filename '%s'\n", fname);
       return 0;
   }

   if ( ext && ext == fname ) {   /* then no filename prefix */
      if ( g_opts.debug > 0 )
         fprintf(stderr,"-- no prefix for filename '%s'\n", fname);
      return 0;
   }
   return 1;
}